

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O0

Aig_Man_t *
introduceAbsorberLogic(Aig_Man_t *pAig,int *pLiveIndex_0,int *pLiveIndex_k,int nonFirstIteration)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Aig_Man_t *p;
  size_t sVar3;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *p1;
  Aig_Obj_t *local_100;
  Aig_Obj_t *local_f8;
  Aig_Obj_t *local_d8;
  int nRegCount;
  int liCopied;
  int liCreated;
  int loCopied;
  int loCreated;
  int piCopied;
  int i;
  Aig_Obj_t *pSecondAbsorberOr;
  Aig_Obj_t *pFirstAbsorberOr;
  Aig_Obj_t *pPOutCo;
  Aig_Obj_t *pPOut;
  Aig_Obj_t *pPIn;
  Aig_Obj_t *pPOutNewArg;
  Aig_Obj_t *pPInNewArg;
  Aig_Obj_t *pObjAbsorberLo;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNewAig;
  int nonFirstIteration_local;
  int *pLiveIndex_k_local;
  int *pLiveIndex_0_local;
  Aig_Man_t *pAig_local;
  
  pFirstAbsorberOr = (Aig_Obj_t *)0x0;
  liCopied = 0;
  if (*pLiveIndex_0 == -1) {
    __assert_fail("*pLiveIndex_0 != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                  ,0xb9,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
  }
  if (nonFirstIteration == 0) {
    if (*pLiveIndex_k != -1) {
      __assert_fail("*pLiveIndex_k == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                    ,0xbb,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
    }
  }
  else if (*pLiveIndex_k == -1) {
    __assert_fail("*pLiveIndex_k != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                  ,0xbd,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
  }
  iVar2 = Aig_ManObjNumMax(pAig);
  p = Aig_ManStart(iVar2);
  sVar3 = strlen(pAig->pName);
  pcVar4 = (char *)malloc(sVar3 + 5);
  p->pName = pcVar4;
  sprintf(p->pName,"%s_%s",pAig->pName,"kCS");
  p->pSpec = (char *)0x0;
  pAVar5 = readLiveSignal_0(pAig,*pLiveIndex_0);
  if (*pLiveIndex_k == -1) {
    pPOutCo = (Aig_Obj_t *)0x0;
  }
  else {
    pPOutCo = readLiveSignal_k(pAig,*pLiveIndex_k);
  }
  pAVar6 = Aig_ManConst1(pAig);
  pAVar7 = Aig_ManConst1(p);
  (pAVar6->field_5).pData = pAVar7;
  for (loCreated = 0; iVar2 = Saig_ManPiNum(pAig), loCreated < iVar2; loCreated = loCreated + 1) {
    pvVar8 = Vec_PtrEntry(pAig->vCis,loCreated);
    pAVar6 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar6;
  }
  for (loCreated = 0; iVar2 = Saig_ManRegNum(pAig), loCreated < iVar2; loCreated = loCreated + 1) {
    pVVar1 = pAig->vCis;
    iVar2 = Saig_ManPiNum(pAig);
    pvVar8 = Vec_PtrEntry(pVVar1,loCreated + iVar2);
    liCopied = liCopied + 1;
    pAVar6 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar8 + 0x28) = pAVar6;
  }
  pAVar6 = Aig_ObjCreateCi(p);
  for (loCreated = 0; iVar2 = Vec_PtrSize(pAig->vObjs), loCreated < iVar2; loCreated = loCreated + 1
      ) {
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,loCreated);
    if ((pAVar7 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar7), iVar2 != 0)) {
      pAVar9 = Aig_ObjChild0Copy(pAVar7);
      p1 = Aig_ObjChild1Copy(pAVar7);
      pAVar9 = Aig_And(p,pAVar9,p1);
      (pAVar7->field_5).pData = pAVar9;
    }
  }
  if (nonFirstIteration == 0) {
    if (pAVar5 == (Aig_Obj_t *)0x0) {
      __assert_fail("pPIn",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                    ,0x100,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
    }
    iVar2 = Aig_IsComplement(pAVar5);
    if (iVar2 == 0) {
      pAVar5 = Aig_Regular(pAVar5);
      local_d8 = (Aig_Obj_t *)(pAVar5->field_5).pData;
    }
    else {
      pAVar5 = Aig_Regular(pAVar5);
      local_d8 = Aig_Not((Aig_Obj_t *)(pAVar5->field_5).pData);
    }
    pAVar5 = Aig_Not(local_d8);
    pSecondAbsorberOr = Aig_Or(p,pAVar5,pAVar6);
    pAVar5 = Aig_Not(pAVar6);
    _piCopied = Aig_Or(p,local_d8,pAVar5);
  }
  else {
    if (pPOutCo == (Aig_Obj_t *)0x0) {
      __assert_fail("pPOut",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                    ,0x10b,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
    }
    iVar2 = Aig_IsComplement(pAVar5);
    if (iVar2 == 0) {
      pAVar5 = Aig_Regular(pAVar5);
      local_f8 = (Aig_Obj_t *)(pAVar5->field_5).pData;
    }
    else {
      pAVar5 = Aig_Regular(pAVar5);
      local_f8 = Aig_Not((Aig_Obj_t *)(pAVar5->field_5).pData);
    }
    iVar2 = Aig_IsComplement(pPOutCo);
    if (iVar2 == 0) {
      pAVar5 = Aig_Regular(pPOutCo);
      local_100 = (Aig_Obj_t *)(pAVar5->field_5).pData;
    }
    else {
      pAVar5 = Aig_Regular(pPOutCo);
      local_100 = Aig_Not((Aig_Obj_t *)(pAVar5->field_5).pData);
    }
    pAVar5 = Aig_Not(local_100);
    pSecondAbsorberOr = Aig_Or(p,pAVar5,pAVar6);
    pAVar5 = Aig_Not(pAVar6);
    _piCopied = Aig_Or(p,local_f8,pAVar5);
  }
  for (loCreated = 0; iVar2 = Saig_ManPoNum(pAig), loCreated < iVar2; loCreated = loCreated + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,loCreated);
    pAVar6 = Aig_ObjChild0Copy(pAVar5);
    pAVar6 = Aig_ObjCreateCo(p,pAVar6);
    (pAVar5->field_5).pData = pAVar6;
    if (loCreated == *pLiveIndex_k) {
      pFirstAbsorberOr = (Aig_Obj_t *)(pAVar5->field_5).pData;
    }
  }
  if (nonFirstIteration == 0) {
    if (pFirstAbsorberOr != (Aig_Obj_t *)0x0) {
      __assert_fail("pPOutCo == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                    ,0x125,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
    }
    Aig_ObjCreateCo(p,_piCopied);
    *pLiveIndex_k = loCreated;
  }
  else {
    if (pFirstAbsorberOr == (Aig_Obj_t *)0x0) {
      __assert_fail("pPOutCo != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                    ,300,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
    }
    Aig_ObjPatchFanin0(p,pFirstAbsorberOr,_piCopied);
  }
  for (loCreated = 0; iVar2 = Saig_ManRegNum(pAig), loCreated < iVar2; loCreated = loCreated + 1) {
    pVVar1 = pAig->vCos;
    iVar2 = Saig_ManPoNum(pAig);
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,loCreated + iVar2);
    pAVar5 = Aig_ObjChild0Copy(pAVar5);
    Aig_ObjCreateCo(p,pAVar5);
  }
  Aig_ObjCreateCo(p,pSecondAbsorberOr);
  Aig_ManSetRegNum(p,liCopied + 1);
  Aig_ManCleanup(p);
  iVar2 = Aig_ManCheck(p);
  if (iVar2 != 0) {
    if (*pLiveIndex_k != -1) {
      return p;
    }
    __assert_fail("*pLiveIndex_k != - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                  ,0x142,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
  }
  __assert_fail("Aig_ManCheck( pNewAig )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                ,0x140,"Aig_Man_t *introduceAbsorberLogic(Aig_Man_t *, int *, int *, int)");
}

Assistant:

Aig_Man_t *introduceAbsorberLogic( Aig_Man_t *pAig, int *pLiveIndex_0, int *pLiveIndex_k, int nonFirstIteration )
{
	Aig_Man_t *pNewAig;
	Aig_Obj_t *pObj, *pObjAbsorberLo, *pPInNewArg, *pPOutNewArg;
	Aig_Obj_t *pPIn = NULL, *pPOut = NULL, *pPOutCo = NULL;
	Aig_Obj_t *pFirstAbsorberOr, *pSecondAbsorberOr;
	int i;
	int piCopied = 0, loCreated = 0, loCopied = 0, liCreated = 0, liCopied = 0; 
	int nRegCount;

	assert(*pLiveIndex_0 != -1);
	if(nonFirstIteration == 0)
		assert( *pLiveIndex_k == -1 );
	else
		assert( *pLiveIndex_k != -1  );

	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_kCS") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "kCS");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// reading the signal pIn, and pOut
	//****************************************************************

	pPIn = readLiveSignal_0( pAig, *pLiveIndex_0 );
	if( *pLiveIndex_k == -1 )
		pPOut = NULL;
	else
		pPOut = readLiveSignal_k( pAig, *pLiveIndex_k );
    
	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//****************************************************************
	// Step 6: create "D" register output for the ABSORBER logic
	//****************************************************************
	loCreated++;
	pObjAbsorberLo = Aig_ObjCreateCi( pNewAig );

	nRegCount = loCreated + loCopied;

	//********************************************************************
	// Step 7: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}

	//****************************************************************
	// Step 8: create the two OR gates of the OBSERVER logic
	//****************************************************************
	if( nonFirstIteration == 0 )
	{
		assert(pPIn);
		
		pPInNewArg = !Aig_IsComplement(pPIn)? 
				(Aig_Obj_t *)((Aig_Regular(pPIn))->pData) : 
				Aig_Not((Aig_Obj_t *)((Aig_Regular(pPIn))->pData));

		pFirstAbsorberOr = Aig_Or( pNewAig, Aig_Not(pPInNewArg), pObjAbsorberLo );
		pSecondAbsorberOr = Aig_Or( pNewAig, pPInNewArg, Aig_Not(pObjAbsorberLo) );
	}
	else
	{
		assert( pPOut );

		pPInNewArg = !Aig_IsComplement(pPIn)? 
				(Aig_Obj_t *)((Aig_Regular(pPIn))->pData) : 
				Aig_Not((Aig_Obj_t *)((Aig_Regular(pPIn))->pData));
		pPOutNewArg = !Aig_IsComplement(pPOut)? 
				(Aig_Obj_t *)((Aig_Regular(pPOut))->pData) : 
				Aig_Not((Aig_Obj_t *)((Aig_Regular(pPOut))->pData));
		
		pFirstAbsorberOr = Aig_Or( pNewAig, Aig_Not(pPOutNewArg), pObjAbsorberLo );
		pSecondAbsorberOr = Aig_Or( pNewAig, pPInNewArg, Aig_Not(pObjAbsorberLo) );
	}	
	
	//********************************************************************
	// Step 9: create primary outputs 
	//********************************************************************
	Saig_ManForEachPo( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
		if( i == *pLiveIndex_k )
			pPOutCo = (Aig_Obj_t *)(pObj->pData);
	}

	//create new po
	if( nonFirstIteration == 0 )
	{
		assert(pPOutCo == NULL);
		pPOutCo = Aig_ObjCreateCo( pNewAig, pSecondAbsorberOr ); 	

		*pLiveIndex_k = i;
	}	
	else
	{
		assert( pPOutCo != NULL );
		//pPOutCo = Aig_ObjCreateCo( pNewAig, pSecondAbsorberOr ); 	
		//*pLiveIndex_k = Saig_ManPoNum(pAig);

		Aig_ObjPatchFanin0( pNewAig, pPOutCo, pSecondAbsorberOr );
	}

	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}

	//create new li
	liCreated++;
	Aig_ObjCreateCo( pNewAig, pFirstAbsorberOr );

	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	
	assert( Aig_ManCheck( pNewAig ) );

	assert( *pLiveIndex_k != - 1);
	return pNewAig;
}